

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O2

void fft_exec(fft_object obj,fft_data *inp,fft_data *oup)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  fft_data *oup_00;
  fft_data *oup_01;
  fft_data *inp_00;
  fft_data *oup_02;
  void *__ptr;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  fft_data *pfVar10;
  double *pdVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  size_t __size;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  
  if (obj->lt != 1) {
    if (obj->lt == 0) {
      mixed_radix_dit_rec(oup,inp,obj,obj->sgn,obj->N,1,0);
    }
    return;
  }
  uVar3 = obj->N;
  lVar17 = (long)(int)uVar3;
  iVar4 = obj->sgn;
  obj->lt = 0;
  dVar19 = log10((double)(int)uVar3);
  dVar19 = ceil(dVar19 / 0.3010299956639812);
  dVar19 = exp2(dVar19);
  iVar5 = obj->N;
  iVar6 = obj->sgn;
  uVar12 = (int)dVar19 << ((int)dVar19 < (int)(uVar3 * 2 + -2));
  obj->N = uVar12;
  lVar16 = (long)(int)uVar12;
  __size = lVar16 * 0x10;
  oup_00 = (fft_data *)malloc(__size);
  oup_01 = (fft_data *)malloc(__size);
  inp_00 = (fft_data *)malloc(__size);
  oup_02 = (fft_data *)malloc(__size);
  __ptr = malloc(lVar17 * 0x10);
  uVar18 = 0;
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  iVar14 = uVar3 * 2 + 1;
  iVar15 = 0;
  for (; uVar18 != uVar7; uVar18 = uVar18 + 1) {
    dVar19 = (double)iVar15 * (3.141592653589793 / (double)(int)uVar3);
    dVar20 = cos(dVar19);
    *(double *)((long)__ptr + uVar18 * 0x10) = dVar20;
    dVar19 = sin(dVar19);
    *(double *)((long)__ptr + uVar18 * 0x10 + 8) = dVar19;
    inp_00[uVar18].re = dVar20;
    inp_00[uVar18].im = dVar19;
    iVar15 = iVar15 + iVar14;
    do {
      iVar15 = iVar15 + uVar3 * -2;
    } while (iVar15 != uVar3 * 2 && SBORROW4(iVar15,uVar3 * 2) == (int)(iVar15 + uVar3 * -2) < 0);
    iVar14 = iVar14 + 2;
  }
  pfVar10 = inp_00 + lVar17;
  for (lVar13 = lVar17; lVar13 <= (int)(uVar12 - uVar3); lVar13 = lVar13 + 1) {
    pfVar10->re = 0.0;
    pfVar10->im = 0.0;
    pfVar10 = pfVar10 + 1;
  }
  pdVar8 = &inp_00[(lVar16 + 1) - lVar17].im;
  pdVar11 = (double *)((long)__ptr + (lVar17 * 0x10 - 8U));
  lVar13 = lVar16 - lVar17;
  while (lVar13 = lVar13 + 1, lVar13 < lVar16) {
    ((fft_data *)(pdVar8 + -1))->re = pdVar11[-1];
    *pdVar8 = *pdVar11;
    pdVar8 = pdVar8 + 2;
    pdVar11 = pdVar11 + -2;
  }
  uVar9 = 0;
  uVar18 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar18 = uVar9;
  }
  uVar18 = uVar18 * 0x10;
  for (; uVar18 != uVar9; uVar9 = uVar9 + 0x10) {
    *(double *)((long)&inp_00->im + uVar9) =
         *(double *)((long)&inp_00->im + uVar9) * (1.0 / (double)(int)uVar12);
    *(double *)((long)&inp_00->re + uVar9) =
         *(double *)((long)&inp_00->re + uVar9) * (1.0 / (double)(int)uVar12);
  }
  fft_exec(obj,inp_00,oup_01);
  if (iVar4 == 1) {
    for (lVar13 = 0; uVar7 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
      dVar19 = *(double *)((long)&inp->re + lVar13);
      dVar20 = *(double *)((long)&inp->im + lVar13);
      dVar1 = *(double *)((long)__ptr + lVar13);
      dVar2 = *(double *)((long)__ptr + lVar13 + 8);
      *(double *)((long)&inp_00->re + lVar13) = dVar19 * dVar1 + dVar20 * dVar2;
      *(double *)((long)&inp_00->im + lVar13) = dVar1 * dVar20 - dVar19 * dVar2;
    }
  }
  else {
    for (lVar13 = 0; uVar7 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
      dVar19 = *(double *)((long)&inp->re + lVar13);
      dVar20 = *(double *)((long)&inp->im + lVar13);
      dVar1 = *(double *)((long)__ptr + lVar13);
      dVar2 = *(double *)((long)__ptr + lVar13 + 8);
      *(double *)((long)&inp_00->re + lVar13) = dVar19 * dVar1 - dVar2 * dVar20;
      *(double *)((long)&inp_00->im + lVar13) = dVar19 * dVar2 + dVar1 * dVar20;
    }
  }
  pfVar10 = inp_00 + lVar17;
  for (; lVar17 < lVar16; lVar17 = lVar17 + 1) {
    pfVar10->re = 0.0;
    pfVar10->im = 0.0;
    pfVar10 = pfVar10 + 1;
  }
  fft_exec(obj,inp_00,oup_00);
  if (iVar4 == 1) {
    for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 0x10) {
      dVar19 = *(double *)((long)&oup_00->re + uVar9);
      dVar20 = *(double *)((long)&oup_00->im + uVar9);
      dVar1 = *(double *)((long)&oup_01->re + uVar9);
      dVar2 = *(double *)((long)&oup_01->im + uVar9);
      *(double *)((long)&oup_00->im + uVar9) = dVar19 * dVar2 + dVar1 * dVar20;
      *(double *)((long)&oup_00->re + uVar9) = dVar19 * dVar1 - dVar2 * dVar20;
    }
  }
  else {
    for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 0x10) {
      dVar19 = *(double *)((long)&oup_00->re + uVar9);
      dVar20 = *(double *)((long)&oup_00->im + uVar9);
      dVar1 = *(double *)((long)&oup_01->re + uVar9);
      dVar2 = *(double *)((long)&oup_01->im + uVar9);
      *(double *)((long)&oup_00->im + uVar9) = dVar1 * dVar20 - dVar19 * dVar2;
      *(double *)((long)&oup_00->re + uVar9) = dVar19 * dVar1 + dVar20 * dVar2;
    }
  }
  for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 0x10) {
    *(ulong *)((long)&obj->twiddle[0].im + uVar9) =
         *(ulong *)((long)&obj->twiddle[0].im + uVar9) ^ 0x8000000000000000;
  }
  obj->sgn = -iVar4;
  fft_exec(obj,oup_00,oup_02);
  if (iVar4 == 1) {
    for (lVar17 = 0; uVar7 << 4 != lVar17; lVar17 = lVar17 + 0x10) {
      dVar19 = *(double *)((long)&oup_02->re + lVar17);
      dVar20 = *(double *)((long)&oup_02->im + lVar17);
      dVar1 = *(double *)((long)__ptr + lVar17);
      dVar2 = *(double *)((long)__ptr + lVar17 + 8);
      *(double *)((long)&oup->re + lVar17) = dVar19 * dVar1 + dVar20 * dVar2;
      *(double *)((long)&oup->im + lVar17) = dVar1 * dVar20 - dVar19 * dVar2;
    }
  }
  else {
    for (lVar17 = 0; uVar7 << 4 != lVar17; lVar17 = lVar17 + 0x10) {
      dVar19 = *(double *)((long)&oup_02->re + lVar17);
      dVar20 = *(double *)((long)&oup_02->im + lVar17);
      dVar1 = *(double *)((long)__ptr + lVar17);
      dVar2 = *(double *)((long)__ptr + lVar17 + 8);
      *(double *)((long)&oup->re + lVar17) = dVar19 * dVar1 - dVar2 * dVar20;
      *(double *)((long)&oup->im + lVar17) = dVar19 * dVar2 + dVar1 * dVar20;
    }
  }
  obj->sgn = iVar6;
  obj->N = iVar5;
  obj->lt = 1;
  for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 0x10) {
    *(ulong *)((long)&obj->twiddle[0].im + uVar7) =
         *(ulong *)((long)&obj->twiddle[0].im + uVar7) ^ 0x8000000000000000;
  }
  free(oup_00);
  free(oup_02);
  free(inp_00);
  free(oup_01);
  free(__ptr);
  return;
}

Assistant:

void fft_exec(fft_object obj,fft_data *inp,fft_data *oup) {
	if (obj->lt == 0) {
		//fftct_radix3_dit_rec(inp,oup,obj, obj->sgn, obj->N);
		//fftct_mixed_rec(inp,oup,obj, obj->sgn, obj->N);
		//printf("%f \n", 1.785);
		int l,inc;
		int nn,sgn1;
		nn = obj->N;
		sgn1 = obj->sgn;
		l = 1;
		inc = 0;
		//radix3_dit_rec(oup,inp,obj,sgn1,nn,l);
		mixed_radix_dit_rec(oup,inp,obj,sgn1,nn,l,inc);
	} else if (obj->lt == 1){
		//printf("%f \n", 1.785);
		int nn,sgn1;
		nn = obj->N;
		sgn1 = obj->sgn;
		bluestein_fft(inp,oup,obj,sgn1,nn);

	}

}